

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O3

int __thiscall helix::order_book::remove(order_book *this,char *__filename)

{
  int iVar1;
  invalid_argument *this_00;
  iterator it;
  hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
  *local_90;
  char *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_88 = __filename;
  local_90 = (hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
              *)boost::multi_index::detail::
                hashed_index<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::multi_index::detail::nth_layer<1,helix::order,boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,mpl_::na,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<helix::order>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                ::find<unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>
                          ((hashed_index<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::multi_index::detail::nth_layer<1,helix::order,boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,mpl_::na,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<helix::order>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                            *)&(this->_orders).super_type,&local_88,
                           &(this->_orders).super_type.field_0x1,
                           &(this->_orders).super_type.field_0x2);
  if (local_90 !=
      (this->_orders).
      super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>_*,_boost::multi_index::multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>_>
      .member) {
    iVar1 = remove(this,(char *)&local_90);
    return iVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"invalid order id: ","");
  std::__cxx11::to_string(&local_60,(unsigned_long)local_88);
  std::operator+(&local_40,&local_80,&local_60);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void order_book::remove(uint64_t order_id)
{
    auto it = _orders.find(order_id);
    if (it == _orders.end()) {
        throw std::invalid_argument(std::string("invalid order id: ") + std::to_string(order_id));
    }
    remove(it);
}